

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O0

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstruct<float>_>::CopyFrom
          (TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *this,TPZMatrix<float> *mat)

{
  TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *this_00;
  long in_RSI;
  TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *from;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *in_stack_ffffffffffffffc8;
  
  if (in_RSI == 0) {
    this_00 = (TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *)0x0;
  }
  else {
    this_00 = (TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *)
              __dynamic_cast(in_RSI,&TPZMatrix<float>::typeinfo,
                             &TPZDohrPrecond<float,TPZDohrSubstruct<float>>::typeinfo,0);
  }
  if (this_00 == (TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *)0x0) {
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZDohrPrecond<float, TPZDohrSubstruct<float>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = float, TSubStruct = TPZDohrSubstruct<float>]"
                   );
    std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
    std::operator<<((ostream *)&std::cerr,"Aborting...\n");
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  else {
    operator=(this_00,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override        
  {                                                           
    auto *from = dynamic_cast<const TPZDohrPrecond<TVar,TSubStruct> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }